

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricalCircuit::~IfcElectricalCircuit(IfcElectricalCircuit *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject = 0x9c8340;
  *(undefined8 *)&(this->super_IfcSystem).field_0x100 = 0x9c83b8;
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x88 = 0x9c8368;
  (this->super_IfcSystem).super_IfcGroup.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x9c8390;
  puVar1 = *(undefined1 **)
            &(this->super_IfcSystem).super_IfcGroup.super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  if (puVar1 != &(this->super_IfcSystem).super_IfcGroup.super_IfcObject.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject = 0x9c8458;
  *(undefined8 *)&(this->super_IfcSystem).field_0x100 = 0x9c8480;
  puVar1 = *(undefined1 **)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x60;
  if (puVar1 != &(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x38;
  if (puVar1 != &(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x48) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcElectricalCircuit() : Object("IfcElectricalCircuit") {}